

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::MILSpec::DictionaryType::_InternalParse
          (DictionaryType *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  ValueType *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *pbVar3;
  Arena *pAVar4;
  uint res;
  pair<const_char_*,_unsigned_int> pVar5;
  byte *local_30;
  
  local_30 = (byte *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *local_30;
      res = (uint)bVar1;
      pbVar3 = local_30 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar3 * 0x80) - 0x80;
        if ((char)*pbVar3 < '\0') {
          pVar5 = google::protobuf::internal::ReadTagFallback((char *)local_30,res);
          pbVar3 = (byte *)pVar5.first;
          res = pVar5.second;
        }
        else {
          pbVar3 = local_30 + 2;
        }
      }
      local_30 = pbVar3;
      if (res >> 3 == 2) {
        if ((char)res == '\x12') {
          msg = this->valuetype_;
          if (msg == (ValueType *)0x0) {
            pAVar4 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
            if ((this_00->ptr_ & 1U) != 0) {
              pAVar4 = *(Arena **)pAVar4;
            }
            msg = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::MILSpec::ValueType>(pAVar4);
            this->valuetype_ = msg;
          }
          goto LAB_00208ff6;
        }
LAB_00209003:
        if ((res == 0) || ((res & 7) == 4)) {
          if (pbVar3 == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)pbVar3;
        }
        if ((this_00->ptr_ & 1U) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((this_00->ptr_ & 0xfffffffffffffffcU) + 8);
        }
        local_30 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (res,unknown,(char *)local_30,ctx);
      }
      else {
        if ((res >> 3 != 1) || ((char)res != '\n')) goto LAB_00209003;
        msg = this->keytype_;
        if (msg == (ValueType *)0x0) {
          pAVar4 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
          if ((this_00->ptr_ & 1U) != 0) {
            pAVar4 = *(Arena **)pAVar4;
          }
          msg = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MILSpec::ValueType>(pAVar4);
          this->keytype_ = msg;
        }
LAB_00208ff6:
        local_30 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                     (ctx,&msg->super_MessageLite,(char *)local_30);
      }
      if (local_30 == (byte *)0x0) {
        return (char *)0x0;
      }
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_30;
}

Assistant:

const char* DictionaryType::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.MILSpec.ValueType keyType = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ctx->ParseMessage(_internal_mutable_keytype(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.MILSpec.ValueType valueType = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_valuetype(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}